

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOUT_madhu.cpp
# Opt level: O1

vector<Track,_std::allocator<Track>_> *
IOU_tracker(vector<Track,_std::allocator<Track>_> *__return_storage_ptr__,float sigma_l,
           float sigma_h,float sigma_iou,int t_min,
           vector<std::vector<Boundingbox,_std::allocator<Boundingbox>_>,_std::allocator<std::vector<Boundingbox,_std::allocator<Boundingbox>_>_>_>
           *detections)

{
  Boundingbox *pBVar1;
  pointer pBVar2;
  pointer pBVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Boundingbox box1;
  Boundingbox box2;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  float fVar12;
  float fVar13;
  ulong uVar14;
  pointer pBVar15;
  pointer __x;
  long lVar16;
  ulong uVar17;
  pointer pTVar18;
  int iVar19;
  ulong uVar20;
  float fVar21;
  Track track;
  vector<Track,_std::allocator<Track>_> active_tracks;
  Boundingbox box;
  vector<Boundingbox,_std::allocator<Boundingbox>_> new_box;
  vector<Boundingbox,_std::allocator<Boundingbox>_> frame_boxes;
  int local_168;
  value_type local_160;
  vector<Track,_std::allocator<Track>_> local_138;
  Boundingbox local_118;
  float local_100;
  float local_fc;
  void *local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  vector<Boundingbox,_std::allocator<Boundingbox>_> local_d8;
  ulong local_c0;
  vector<Boundingbox,_std::allocator<Boundingbox>_> *local_b8;
  vector<Boundingbox,_std::allocator<Boundingbox>_> *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  float local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  Boundingbox local_68;
  vector<Boundingbox,_std::allocator<Boundingbox>_> local_48;
  
  local_138.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_138.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_138.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Track,_std::allocator<Track>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Track,_std::allocator<Track>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Track,_std::allocator<Track>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0 = *(vector<Boundingbox,_std::allocator<Boundingbox>_> **)detections;
  local_b8 = *(vector<Boundingbox,_std::allocator<Boundingbox>_> **)(detections + 8);
  local_100 = sigma_iou;
  std::vector<Boundingbox,_std::allocator<Boundingbox>_>::vector(&local_d8,local_b0);
  local_c0 = (ulong)t_min;
  if (local_138.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_138.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar14 = 0;
    local_168 = 0;
    do {
      pTVar18 = local_138.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
                super__Vector_impl_data._M_start + uVar14;
      std::vector<Boundingbox,_std::allocator<Boundingbox>_>::vector
                (&local_160.boxes,&pTVar18->boxes);
      local_160.track_id = pTVar18->track_id;
      uVar4 = pTVar18->max_score;
      uVar6 = pTVar18->start_frame;
      local_68.x = local_160.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-1].x;
      local_68.y = local_160.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-1].y;
      local_68.w = local_160.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-1].w;
      local_68.h = local_160.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-1].h;
      local_68.score =
           local_160.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].score;
      local_160.max_score = (float)uVar4;
      local_160.start_frame = uVar6;
      std::vector<Boundingbox,_std::allocator<Boundingbox>_>::vector(&local_48,&local_d8);
      pBVar2 = local_48.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_118.x = local_68.x;
      local_118.y = local_68.y;
      local_118.w = local_68.w;
      local_118.h = local_68.h;
      local_118.score = local_68.score;
      if ((long)local_48.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_48.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                super__Vector_impl_data._M_start == 0) {
        iVar19 = -1;
      }
      else {
        lVar16 = ((long)local_48.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
        uVar20 = 0xffffffff;
        fVar21 = 0.0;
        uVar17 = 0;
        pBVar15 = local_48.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          local_e8 = CONCAT44(local_e8._4_4_,pBVar15->score);
          local_f8 = *(void **)pBVar15;
          uStack_f0._0_4_ = pBVar15->w;
          uStack_f0._4_4_ = pBVar15->h;
          box1.w = local_118.w;
          box1.h = local_118.h;
          box1.x = local_118.x;
          box1.y = local_118.y;
          box1.score = local_118.score;
          local_fc = fVar21;
          fVar21 = find_IOU(box1,*pBVar15);
          if (local_fc < fVar21) {
            uVar20 = uVar17 & 0xffffffff;
          }
          iVar19 = (int)uVar20;
          if (fVar21 <= local_fc) {
            fVar21 = local_fc;
          }
          uVar17 = uVar17 + 1;
          pBVar15 = pBVar15 + 1;
        } while (lVar16 + (ulong)(lVar16 == 0) != uVar17);
      }
      if (pBVar2 != (Boundingbox *)0x0) {
        operator_delete(pBVar2);
      }
      pBVar15 = local_d8.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                super__Vector_impl_data._M_start;
      pBVar2 = local_160.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if (iVar19 == -1) {
LAB_00105b62:
        if ((sigma_h < local_160.max_score) &&
           (uVar17 = ((long)local_160.boxes.
                            super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_160.boxes.
                            super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) * -0x3333333333333333,
           local_c0 <= uVar17 && uVar17 - local_c0 != 0)) {
          std::vector<Track,_std::allocator<Track>_>::push_back(__return_storage_ptr__,&local_160);
        }
        std::vector<Track,_std::allocator<Track>_>::_M_erase
                  (&local_138,
                   local_138.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar14);
      }
      else {
        pBVar1 = local_160.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1;
        local_88._0_4_ = pBVar1->x;
        local_88._4_4_ = pBVar1->y;
        uStack_80._0_4_ =
             local_160.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].w;
        uStack_80._4_4_ =
             local_160.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].h;
        local_78 = local_160.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-1].score;
        pBVar3 = local_d8.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar19;
        local_a8._0_4_ = pBVar3->x;
        local_a8._4_4_ = pBVar3->y;
        uStack_a0._0_4_ = pBVar3->w;
        uStack_a0._4_4_ = pBVar3->h;
        uVar8 = pBVar3->x;
        uVar9 = pBVar3->y;
        uVar10 = pBVar3->w;
        uVar11 = pBVar3->h;
        box2.h = (float)uVar11;
        box2.w = (float)uVar10;
        box2.y = (float)uVar9;
        box2.x = (float)uVar8;
        local_98 = local_d8.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar19].score;
        box2.score = local_98;
        fVar21 = find_IOU(*pBVar1,box2);
        if (fVar21 < local_100) goto LAB_00105b62;
        pBVar1 = pBVar15 + iVar19;
        if (pBVar2 == local_160.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Boundingbox,std::allocator<Boundingbox>>::
          _M_realloc_insert<Boundingbox_const&>
                    ((vector<Boundingbox,std::allocator<Boundingbox>> *)&local_160,(iterator)pBVar2,
                     pBVar1);
        }
        else {
          pBVar2->score = pBVar1->score;
          fVar21 = pBVar1->y;
          fVar12 = pBVar1->w;
          fVar13 = pBVar1->h;
          pBVar2->x = pBVar1->x;
          pBVar2->y = fVar21;
          pBVar2->w = fVar12;
          pBVar2->h = fVar13;
          local_160.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_160.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl
               .super__Vector_impl_data._M_finish + 1;
        }
        if (local_160.max_score <
            local_d8.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
            super__Vector_impl_data._M_start[iVar19].score) {
          local_160.max_score =
               local_d8.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
               super__Vector_impl_data._M_start[iVar19].score;
        }
        pBVar2 = local_d8.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar19 + 1;
        if (pBVar2 != local_d8.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl
                      .super__Vector_impl_data._M_finish) {
          memmove(local_d8.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                  super__Vector_impl_data._M_start + iVar19,pBVar2,
                  (long)local_d8.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pBVar2);
        }
        local_d8.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_d8.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
        pTVar18 = local_138.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar14;
        std::vector<Boundingbox,_std::allocator<Boundingbox>_>::operator=
                  (&pTVar18->boxes,&local_160.boxes);
        pTVar18->track_id = local_160.track_id;
        pTVar18->max_score = local_160.max_score;
        pTVar18->start_frame = local_160.start_frame;
        local_168 = local_168 + 1;
      }
      if (local_160.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_160.boxes.
                        super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar14 = (ulong)local_168;
      uVar17 = ((long)local_138.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_138.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    } while (uVar14 <= uVar17 && uVar17 - uVar14 != 0);
  }
  pBVar2 = local_d8.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_d8.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_d8.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pBVar15 = local_d8.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_118.score = pBVar15->score;
      local_118.x = pBVar15->x;
      local_118.y = pBVar15->y;
      local_118.w = pBVar15->w;
      local_118.h = pBVar15->h;
      local_f8 = (void *)0x0;
      uStack_f0 = 0;
      local_e8 = 0;
      std::vector<Boundingbox,std::allocator<Boundingbox>>::_M_realloc_insert<Boundingbox_const&>
                ((vector<Boundingbox,std::allocator<Boundingbox>> *)&local_f8,(iterator)0x0,
                 &local_118);
      std::vector<Boundingbox,_std::allocator<Boundingbox>_>::vector
                (&local_160.boxes,(vector<Boundingbox,_std::allocator<Boundingbox>_> *)&local_f8);
      local_160.max_score = local_118.score;
      local_160.start_frame = 0;
      local_160.track_id = 0;
      std::vector<Track,_std::allocator<Track>_>::push_back(&local_138,&local_160);
      if (local_160.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_160.boxes.
                        super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_f8 != (void *)0x0) {
        operator_delete(local_f8);
      }
      pBVar15 = pBVar15 + 1;
    } while (pBVar15 != pBVar2);
  }
  pTVar18 = local_138.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_138.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_138.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    __x = local_138.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
          super__Vector_impl_data._M_start;
    do {
      std::vector<Boundingbox,_std::allocator<Boundingbox>_>::vector(&local_160.boxes,&__x->boxes);
      local_160.track_id = __x->track_id;
      uVar5 = __x->max_score;
      uVar7 = __x->start_frame;
      local_160.max_score = (float)uVar5;
      local_160.start_frame = uVar7;
      if ((sigma_h <= (float)uVar5) &&
         (local_c0 <=
          (ulong)(((long)local_160.boxes.
                         super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_160.boxes.
                         super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2) * -0x3333333333333333))) {
        std::vector<Track,_std::allocator<Track>_>::push_back(__return_storage_ptr__,&local_160);
      }
      if (local_160.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_160.boxes.
                        super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      __x = __x + 1;
    } while (__x != pTVar18);
  }
  if (local_d8.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b8 == local_b0) {
    std::vector<Track,_std::allocator<Track>_>::~vector(__return_storage_ptr__);
  }
  std::vector<Track,_std::allocator<Track>_>::~vector(&local_138);
  return __return_storage_ptr__;
}

Assistant:

std::vector< Track > IOU_tracker(float sigma_l, float sigma_h, float sigma_iou, int t_min, std::vector< std::vector<Boundingbox> > detections)
{
	
	int index;
	bool updated;

	// initiate active tracks, finished tracks
	std::vector<Track> active_tracks;
	std::vector<Track> finished_tracks;

	// do for all the frames
	for (int frame_no = 0; frame_no < detections.size(); frame_no++)
	{
		// get detections from the frame
		std::vector<Boundingbox> frame_boxes = detections[frame_no];

		// for each track in active tracks
		for (int i = 0; i < active_tracks.size(); i++)
		{
			Track track = active_tracks[i];
			updated = false;
			// the index of box with highest iou
			index = Highest_iou(track.boxes.back(), frame_boxes);

			// if no box is found or 
			if (index != -1 && find_IOU(track.boxes.back(), frame_boxes[index]) >= sigma_iou)
			{
				track.boxes.push_back(frame_boxes[index]);

				if (track.max_score < frame_boxes[index].score)
				{
					// update the score in tracks
					track.max_score = frame_boxes[index].score;
				}
				frame_boxes.erase(frame_boxes.begin() + index);

				// updating the track
				active_tracks[i] = track;
				updated = true;
			}

			// if not updated, append them into finished tracks
			if (!updated)
			{
				if (track.max_score > sigma_h && track.boxes.size() > t_min)
				{
					finished_tracks.push_back(track);	
				}
				// 
				active_tracks.erase(active_tracks.begin() + i);

				i--;
			}
		}

		// add new tracks in active tracks
		for ( auto box : frame_boxes)
		{
			std::vector<Boundingbox> new_box;

			new_box.push_back(box);

			Track t = {new_box, box.score, frame_no, 0};
			
			active_tracks.push_back(t);
		}

		// creating new tracks
		for (auto track : active_tracks)
		{
			if (track.max_score >= sigma_h && track.boxes.size() >= t_min)
			{
				finished_tracks.push_back(track);
			}
		}

		return finished_tracks;

	}
}